

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

char * nng_http_get_version(nng_http *conn)

{
  char *pcVar1;
  nng_http *conn_local;
  
  pcVar1 = nni_http_get_version(conn);
  return pcVar1;
}

Assistant:

const char *
nng_http_get_version(nng_http *conn)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_get_version(conn));
#else
	NNI_ARG_UNUSED(res);
	return (NULL);
#endif
}